

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analysis.cc
# Opt level: O2

void __thiscall kratos::LatchVisitor::IfVisitor::visit(IfVisitor *this,IfStmt *stmt)

{
  bool bVar1;
  __shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2> local_30;
  IfStmt *local_20;
  IfStmt *stmt_local;
  
  local_20 = stmt;
  std::__shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_30,
             &(stmt->predicate_).super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>);
  bVar1 = has_var(local_30._M_ptr,this->var_);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_30._M_refcount);
  if (bVar1) {
    std::
    _Hashtable<kratos::IfStmt*,kratos::IfStmt*,std::allocator<kratos::IfStmt*>,std::__detail::_Identity,std::equal_to<kratos::IfStmt*>,std::hash<kratos::IfStmt*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
    ::_M_emplace<kratos::IfStmt*&>
              ((_Hashtable<kratos::IfStmt*,kratos::IfStmt*,std::allocator<kratos::IfStmt*>,std::__detail::_Identity,std::equal_to<kratos::IfStmt*>,std::hash<kratos::IfStmt*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                *)&this->ifs_,&local_20);
  }
  return;
}

Assistant:

void visit(IfStmt* stmt) override {
            if (has_var(stmt->predicate().get(), var_)) ifs_.emplace(stmt);
        }